

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O2

drwav_uint64 drwav_read_pcm_frames_le(drwav *pWav,drwav_uint64 framesToRead,void *pBufferOut)

{
  drwav_uint32 dVar1;
  size_t sVar2;
  
  if (framesToRead == 0 || pWav == (drwav *)0x0) {
    return 0;
  }
  if (((pWav->translatedFormatTag != 2) && (pWav->translatedFormatTag != 0x11)) &&
     (dVar1 = drwav_get_bytes_per_pcm_frame(pWav), dVar1 != 0)) {
    sVar2 = framesToRead * dVar1;
    if (sVar2 != 0) {
      sVar2 = drwav_read_raw(pWav,sVar2,pBufferOut);
      return sVar2 / dVar1;
    }
  }
  return 0;
}

Assistant:

DRWAV_API drwav_uint64 drwav_read_pcm_frames_le(drwav* pWav, drwav_uint64 framesToRead, void* pBufferOut)
{
    drwav_uint32 bytesPerFrame;
    drwav_uint64 bytesToRead;   /* Intentionally uint64 instead of size_t so we can do a check that we're not reading too much on 32-bit builds. */

    if (pWav == NULL || framesToRead == 0) {
        return 0;
    }

    /* Cannot use this function for compressed formats. */
    if (drwav__is_compressed_format_tag(pWav->translatedFormatTag)) {
        return 0;
    }

    bytesPerFrame = drwav_get_bytes_per_pcm_frame(pWav);
    if (bytesPerFrame == 0) {
        return 0;
    }

    /* Don't try to read more samples than can potentially fit in the output buffer. */
    bytesToRead = framesToRead * bytesPerFrame;
    if (bytesToRead > DRWAV_SIZE_MAX) {
        bytesToRead = (DRWAV_SIZE_MAX / bytesPerFrame) * bytesPerFrame; /* Round the number of bytes to read to a clean frame boundary. */
    }

    /*
    Doing an explicit check here just to make it clear that we don't want to be attempt to read anything if there's no bytes to read. There
    *could* be a time where it evaluates to 0 due to overflowing.
    */
    if (bytesToRead == 0) {
        return 0;
    }

    return drwav_read_raw(pWav, (size_t)bytesToRead, pBufferOut) / bytesPerFrame;
}